

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfs_malloc.cc
# Opt level: O2

bool __thiscall HugetlbSysAllocator::Initialize(HugetlbSysAllocator *this)

{
  undefined1 auVar1 [16];
  LogItem b;
  LogItem c;
  LogItem d;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_t __n;
  LogMode mode;
  char *pcVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 local_1188;
  char path [4096];
  anon_union_8_4_e5b1a622_for_u_ local_160;
  statfs sfs;
  anon_union_8_4_e5b1a622_for_u_ aStack_e0;
  undefined4 uStack_d4;
  anon_union_8_4_e5b1a622_for_u_ aStack_d0;
  undefined4 uStack_c4;
  anon_union_8_4_e5b1a622_for_u_ aStack_c0;
  undefined4 uStack_b4;
  anon_union_8_4_e5b1a622_for_u_ aStack_b0;
  undefined4 uStack_a4;
  anon_union_8_4_e5b1a622_for_u_ aStack_a0;
  undefined4 uStack_94;
  anon_union_8_4_e5b1a622_for_u_ aStack_90;
  undefined4 uStack_84;
  anon_union_8_4_e5b1a622_for_u_ aStack_80;
  uint uStack_74;
  uint uStack_64;
  uint uStack_54;
  uint uStack_44;
  uint uStack_34;
  
  if ((DAT_00124bc8 << 0x20) - 0xff800000001U < 0xffffefffffffffff) {
    sfs.f_spare[3]._0_4_ = 4;
    uVar9 = CONCAT44(uStack_c4,4);
    lVar8 = CONCAT44(uStack_d4,4);
    lVar7 = CONCAT44(sfs.f_spare[3]._4_4_,4);
    pcVar5 = "XX fatal: memfs_malloc_path too long";
    mode = kCrash;
    bVar6 = false;
    iVar2 = 0xe5;
  }
  else {
    __n = (DAT_00124bc8 << 0x20) >> 0x20;
    aStack_e0.str = (char *)&local_1188;
    memcpy(aStack_e0.ptr,
           FLAG__namespace_do_not_use_directly_use_DECLARE_string_instead::
           FLAGS_memfs_malloc_path_abi_cxx11_,__n);
    *(undefined8 *)((long)&local_1188 + __n) = 0x5858585858582e;
    iVar2 = mkstemp(aStack_e0.str);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError((SafeStrError *)&local_160,*piVar4);
      uVar9 = CONCAT44(uStack_b4,4);
      lVar8 = (ulong)uStack_64 << 0x20;
      lVar7 = (ulong)uStack_74 << 0x20;
      pcVar5 = "warning: unable to create memfs_malloc_path";
      bVar6 = false;
      mode = kLog;
      iVar2 = 0xed;
      aStack_d0 = local_160;
      aStack_c0 = aStack_b0;
    }
    else {
      aStack_e0.str = (char *)&local_1188;
      iVar3 = unlink(aStack_e0.str);
      if (iVar3 == -1) {
        piVar4 = __errno_location();
        tcmalloc::SafeStrError::SafeStrError((SafeStrError *)&local_160,*piVar4);
        uVar9 = CONCAT44(uStack_a4,4);
        lVar8 = (ulong)uStack_44 << 0x20;
        lVar7 = (ulong)uStack_54 << 0x20;
        pcVar5 = "fatal: error unlinking memfs_malloc_path";
        mode = kCrash;
        bVar6 = false;
        iVar2 = 0xf5;
        aStack_d0 = local_160;
        aStack_c0 = aStack_a0;
      }
      else {
        iVar3 = fstatfs(iVar2,(statfs *)&local_160);
        bVar6 = iVar3 != -1;
        if (bVar6) {
          this->hugetlb_fd_ = iVar2;
          this->big_page_size_ = sfs.f_type;
          this->failed_ = false;
          return bVar6;
        }
        piVar4 = __errno_location();
        tcmalloc::SafeStrError::SafeStrError((SafeStrError *)(path + 0xff8),*piVar4);
        uVar9 = CONCAT44(uStack_84,4);
        lVar8 = CONCAT44(uStack_94,4);
        lVar7 = (ulong)uStack_34 << 0x20;
        pcVar5 = "fatal: error fstatfs of memfs_malloc_path";
        mode = kCrash;
        iVar2 = 0xfe;
        aStack_e0 = (anon_union_8_4_e5b1a622_for_u_)path._4088_8_;
        aStack_d0 = aStack_90;
        aStack_c0 = aStack_80;
      }
    }
  }
  b.u_.str = aStack_e0.str;
  b._0_8_ = lVar7;
  c.u_.str = aStack_d0.str;
  c._0_8_ = lVar8;
  d.u_.str = aStack_c0.str;
  d._0_8_ = uVar9;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = pcVar5;
  tcmalloc::Log(mode,
                "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/memfs_malloc.cc"
                ,iVar2,(LogItem)(auVar1 << 0x40),b,c,d);
  return bVar6;
}

Assistant:

bool HugetlbSysAllocator::Initialize() {
  char path[PATH_MAX];
  const int pathlen = FLAGS_memfs_malloc_path.size();
  if (pathlen + 8 > sizeof(path)) {
    Log(kCrash, __FILE__, __LINE__, "XX fatal: memfs_malloc_path too long");
    return false;
  }
  memcpy(path, FLAGS_memfs_malloc_path.data(), pathlen);
  memcpy(path + pathlen, ".XXXXXX", 8);  // Also copies terminating \0

  int hugetlb_fd = mkstemp(path);
  if (hugetlb_fd == -1) {
    Log(kLog, __FILE__, __LINE__,
        "warning: unable to create memfs_malloc_path",
        path, tcmalloc::SafeStrError(errno).c_str());
    return false;
  }

  // Cleanup memory on process exit
  if (unlink(path) == -1) {
    Log(kCrash, __FILE__, __LINE__,
        "fatal: error unlinking memfs_malloc_path", path,
        tcmalloc::SafeStrError(errno).c_str());
    return false;
  }

  // Use fstatfs to figure out the default page size for memfs
  struct statfs sfs;
  if (fstatfs(hugetlb_fd, &sfs) == -1) {
    Log(kCrash, __FILE__, __LINE__,
        "fatal: error fstatfs of memfs_malloc_path",
        tcmalloc::SafeStrError(errno).c_str());
    return false;
  }
  int64_t page_size = sfs.f_bsize;

  hugetlb_fd_ = hugetlb_fd;
  big_page_size_ = page_size;
  failed_ = false;
  return true;
}